

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::(anonymous_namespace)::GridProgram::shadeFragments(GridProgram *this)

{
  GenericVec4 *pGVar1;
  int iVar2;
  FragmentShadingContext *in_RCX;
  uint in_EDX;
  ulong uVar3;
  long in_RSI;
  FragmentPacket *packet;
  int fragNdx;
  int iVar4;
  deUint32 dStack_50;
  deUint32 dStack_4c;
  deUint32 dStack_48;
  deUint32 dStack_44;
  ulong uStack_40;
  long lStack_38;
  
  if (0 < (int)in_EDX) {
    uStack_40 = (ulong)in_EDX;
    iVar4 = 0;
    uVar3 = 0;
    lStack_38 = in_RSI;
    do {
      packet = (FragmentPacket *)(uVar3 * 0x40 + lStack_38);
      fragNdx = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&dStack_50,packet,in_RCX,0,fragNdx);
        pGVar1 = in_RCX->outputArray;
        iVar2 = (iVar4 + fragNdx) * in_RCX->numFragmentOutputs;
        pGVar1[iVar2].v.uData[0] = dStack_50;
        pGVar1[iVar2].v.uData[1] = dStack_4c;
        pGVar1[iVar2].v.uData[2] = dStack_48;
        pGVar1[iVar2].v.uData[3] = dStack_44;
        fragNdx = fragNdx + 1;
      } while (fragNdx != 4);
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar3 != uStack_40);
  }
  return;
}

Assistant:

GridProgram::GridProgram (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_offset", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource("#version 300 es\n"
														"in highp vec4 a_position;\n"
														"in highp vec4 a_offset;\n"
														"in highp vec4 a_color;\n"
														"out mediump vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	gl_Position = a_position + a_offset;\n"
														"	v_color = a_color;\n"
														"}\n")
							<< sglr::pdec::FragmentSource(
														"#version 300 es\n"
														"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
														"in mediump vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	dEQP_FragColor = v_color;\n"
														"}\n"))
{
}